

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int aec_encode(aec_stream *strm,int flush)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 in_ESI;
  long in_RDI;
  internal_state *state;
  int n;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x40);
  *(undefined4 *)(puVar1 + 0x32) = in_ESI;
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10);
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x20) + *(long *)(in_RDI + 0x28);
  do {
    iVar2 = (*(code *)*puVar1)(in_RDI);
  } while (iVar2 == 1);
  if (*(int *)((long)puVar1 + 0x164) != 0) {
    iVar2 = (int)puVar1[0xb] - (int)*(undefined8 *)(in_RDI + 0x18);
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + (long)iVar2;
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) - (long)iVar2;
    *(undefined1 *)(puVar1 + 0xc) = *(undefined1 *)puVar1[0xb];
    puVar1[0xb] = puVar1 + 0xc;
    *(undefined4 *)((long)puVar1 + 0x164) = 0;
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 8);
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) - *(long *)(in_RDI + 0x20);
  return 0;
}

Assistant:

int aec_encode(struct aec_stream *strm, int flush)
{
    /**
       Finite-state machine implementation of the adaptive entropy
       encoder.
    */
    int n;
    struct internal_state *state = strm->state;

    state->flush = flush;
    strm->total_in += strm->avail_in;
    strm->total_out += strm->avail_out;

    while (state->mode(strm) == M_CONTINUE);

    if (state->direct_out) {
        n = (int)(state->cds - strm->next_out);
        strm->next_out += n;
        strm->avail_out -= n;

        *state->cds_buf = *state->cds;
        state->cds = state->cds_buf;
        state->direct_out = 0;
    }
    strm->total_in -= strm->avail_in;
    strm->total_out -= strm->avail_out;
    return AEC_OK;
}